

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_ledger.cpp
# Opt level: O1

ByteData * __thiscall
cfd::api::LedgerApi::Serialize
          (ByteData *__return_storage_ptr__,LedgerApi *this,ConfidentialTransactionContext *tx,
          vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
          *metadata_stack,bool skip_witness,bool is_authorization)

{
  byte bVar1;
  pointer puVar2;
  uint uVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  int32_t iVar9;
  uint32_t uVar10;
  value_type_conflict *__val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pLVar12;
  CfdException *this_00;
  size_t sVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  pointer pLVar17;
  pointer hex;
  LedgerMetaDataStackItem empty_item;
  uint32_t sequence;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  ByteData issuance;
  ConfidentialTxOutReference txout;
  ByteData local_428;
  ByteData local_408;
  ConfidentialAssetId local_3e8;
  ConfidentialValue local_3b8;
  string local_388;
  string local_368;
  undefined1 local_348 [40];
  ConfidentialTransactionContext *local_320;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_308;
  _Alloc_hider local_2f8;
  pointer local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  ByteData local_298;
  ulong local_280;
  Script local_278;
  ByteData local_238;
  ByteData local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
  *local_1f0;
  ByteData local_1e8;
  undefined1 local_1d0 [40];
  uint local_1a8;
  undefined1 local_1a0 [56];
  uint32_t local_168;
  undefined1 local_158 [40];
  undefined1 local_130 [72];
  ConfidentialValue local_e8 [3];
  ConfidentialValue local_70;
  ByteData local_48;
  
  local_320 = tx;
  local_1f0 = metadata_stack;
  iVar8 = (*(tx->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction
            [7])(tx);
  core::ByteData::ByteData(__return_storage_ptr__);
  core::ByteData::ByteData(&local_298);
  core::ByteData::ByteData(&local_1e8);
  iVar9 = core::AbstractTransaction::GetVersion((AbstractTransaction *)local_320);
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
  *(int32_t *)
   local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  *(int32_t *)
   local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = iVar9;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  core::ByteData::ByteData((ByteData *)local_1d0,&local_208);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1d0);
  bVar1 = (byte)iVar8 & (!skip_witness && !is_authorization);
  if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (bVar1 != 0) {
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"0001","");
    core::ByteData::ByteData((ByteData *)local_318,(string *)local_1d0);
    core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_318._0_8_);
    }
    if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
      operator_delete((void *)local_1d0._0_8_);
    }
  }
  uVar10 = core::ConfidentialTransaction::GetTxInCount(&local_320->super_ConfidentialTransaction);
  core::ByteData::GetVariableInt((ByteData *)local_1d0,(ulong)uVar10);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1d0);
  if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  local_280 = CONCAT44(local_280._4_4_,uVar10);
  if (uVar10 != 0) {
    uVar10 = 0;
    do {
      core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_1d0,&local_320->super_ConfidentialTransaction,
                 uVar10);
      core::ByteData::ByteData(&local_408);
      uVar6 = local_1a8;
      local_278._vptr_Script = (_func_int **)0x0;
      local_278.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278._vptr_Script = (_func_int **)operator_new(4);
      uVar3 = uVar6 & 0x3fffffff;
      if (!is_authorization) {
        uVar3 = uVar6;
      }
      local_278.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)((long)local_278._vptr_Script + 4);
      *(uint *)local_278._vptr_Script = 0;
      *(uint *)local_278._vptr_Script = uVar3;
      local_278.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_278.script_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      core::Txid::Txid((Txid *)local_318,(Txid *)(local_1d0 + 8));
      core::Txid::GetData((ByteData *)&local_3e8,(Txid *)local_318);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_408,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_3e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._vptr_ConfidentialAssetId !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_3e8._vptr_ConfidentialAssetId);
      }
      local_318._0_8_ = &PTR__Txid_00735400;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_318._8_8_);
      }
      core::ByteData::ByteData
                ((ByteData *)local_318,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
      core::ByteData::Push(&local_408,(ByteData *)local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_318._0_8_);
      }
      if (!is_authorization) {
        core::Script::Script((Script *)local_318,(Script *)local_1a0);
        core::Script::GetData((ByteData *)&local_3b8,(Script *)local_318);
        core::ByteData::Serialize((ByteData *)&local_3e8,(ByteData *)&local_3b8);
        core::ByteData::Push(&local_408,(ByteData *)&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._vptr_ConfidentialAssetId !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3e8._vptr_ConfidentialAssetId);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._vptr_ConfidentialValue !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3b8._vptr_ConfidentialValue);
        }
        core::Script::~Script((Script *)local_318);
      }
      local_2b0._0_4_ = local_168;
      memcpy(local_278._vptr_Script,&local_2b0,
             (long)local_278.script_data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)local_278._vptr_Script);
      core::ByteData::ByteData
                ((ByteData *)local_318,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_278);
      core::ByteData::Push(&local_408,(ByteData *)local_318);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_318._0_8_);
      }
      if (is_authorization) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)local_318,(ConfidentialValue *)(local_130 + 0x20));
        bVar7 = core::ConfidentialValue::IsEmpty((ConfidentialValue *)local_318);
        if (bVar7) {
          core::ConfidentialValue::ConfidentialValue(&local_70,local_e8);
          bVar7 = core::ConfidentialValue::IsEmpty(&local_70);
          local_70._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
          if (local_70.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          bVar7 = false;
        }
        local_318._0_8_ = &PTR__ConfidentialValue_007357f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_318._8_8_);
        }
        if (bVar7 == false) {
          core::ConfidentialValue::ConfidentialValue
                    ((ConfidentialValue *)local_318,(ConfidentialValue *)(local_130 + 0x20));
          core::ConfidentialValue::GetData((ByteData *)&local_3e8,(ConfidentialValue *)local_318);
          local_318._0_8_ = &PTR__ConfidentialValue_007357f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_318._8_8_);
          }
          bVar7 = core::ByteData::IsEmpty((ByteData *)&local_3e8);
          if (bVar7) {
            local_318._0_8_ = local_318 + 0x10;
            local_318._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x2;
            aStack_308._M_allocated_capacity._0_3_ = 0x3030;
            core::ByteData::ByteData((ByteData *)&local_3b8,(string *)local_318);
            pp_Var4 = local_3e8._vptr_ConfidentialAssetId;
            local_3e8._vptr_ConfidentialAssetId = local_3b8._vptr_ConfidentialValue;
            local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 local_3b8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_3b8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_3b8._vptr_ConfidentialValue = (_func_int **)0x0;
            local_3b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_3b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pp_Var4 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(pp_Var4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._vptr_ConfidentialValue !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_3b8._vptr_ConfidentialValue);
            }
            if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
              operator_delete((void *)local_318._0_8_);
            }
          }
          core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_318,local_e8);
          core::ConfidentialValue::GetData((ByteData *)&local_3b8,(ConfidentialValue *)local_318);
          local_318._0_8_ = &PTR__ConfidentialValue_007357f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_318._8_8_);
          }
          bVar7 = core::ByteData::IsEmpty((ByteData *)&local_3b8);
          if (bVar7) {
            local_318._0_8_ = local_318 + 0x10;
            local_318._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x2;
            aStack_308._M_allocated_capacity._0_3_ = 0x3030;
            core::ByteData::ByteData((ByteData *)local_348,(string *)local_318);
            pp_Var4 = local_3b8._vptr_ConfidentialValue;
            local_3b8._vptr_ConfidentialValue = (_func_int **)local_348._0_8_;
            local_3b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_348._8_8_;
            local_3b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_348._16_8_;
            local_348._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_348._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_348._16_8_ = (pointer)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pp_Var4 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(pp_Var4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_348._0_8_);
            }
            if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
              operator_delete((void *)local_318._0_8_);
            }
          }
          core::ByteData::ByteData((ByteData *)local_318);
          local_388._M_dataplus._M_p = (pointer)0x0;
          local_388._M_string_length = 0;
          local_388.field_2._M_allocated_capacity = 0;
          uVar14 = local_158._32_8_ - local_158._24_8_;
          if (uVar14 == 0) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          }
          else {
            if ((long)uVar14 < 0) {
              std::__throw_bad_alloc();
            }
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(uVar14);
          }
          local_388.field_2._M_allocated_capacity = uVar14 + (long)paVar11;
          sVar13 = local_158._32_8_ - local_158._24_8_;
          local_388._M_dataplus._M_p = (pointer)paVar11;
          if (sVar13 != 0) {
            local_388._M_string_length = (size_type)paVar11;
            memmove(paVar11,(void *)local_158._24_8_,sVar13);
          }
          local_388._M_string_length = (long)paVar11 + sVar13;
          local_368._M_dataplus._M_p = (pointer)0x0;
          local_368._M_string_length = 0;
          local_368.field_2._M_allocated_capacity = 0;
          uVar14 = local_130._16_8_ - local_130._8_8_;
          if (uVar14 == 0) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          }
          else {
            if ((long)uVar14 < 0) {
              std::__throw_bad_alloc();
            }
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(uVar14);
          }
          local_368.field_2._M_allocated_capacity = uVar14 + (long)paVar11;
          sVar13 = local_130._16_8_ - local_130._8_8_;
          local_368._M_dataplus._M_p = (pointer)paVar11;
          if (sVar13 != 0) {
            local_368._M_string_length = (size_type)paVar11;
            memmove(paVar11,(void *)local_130._8_8_,sVar13);
          }
          local_368._M_string_length = (long)paVar11 + sVar13;
          core::ByteData::
          Concat<cfd::core::ByteData256,cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
                    ((ByteData *)local_348,(ByteData *)local_318,(ByteData256 *)&local_388,
                     (ByteData256 *)&local_368,(ByteData *)&local_3e8,(ByteData *)&local_3b8);
          uVar5 = local_318._0_8_;
          local_318._0_8_ = local_348._0_8_;
          local_318._8_8_ = local_348._8_8_;
          aStack_308._M_allocated_capacity = local_348._16_8_;
          local_348._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_348._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_348._16_8_ = (pointer)0x0;
          if ((_func_int **)uVar5 != (_func_int **)0x0) {
            operator_delete((void *)uVar5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_348._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          core::ByteData::Push(&local_1e8,(ByteData *)local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_318._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._vptr_ConfidentialValue !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3b8._vptr_ConfidentialValue);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._vptr_ConfidentialAssetId;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._vptr_ConfidentialAssetId !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_003c6a56;
        }
        else {
          local_318._0_8_ = local_318 + 0x10;
          local_318._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x2;
          aStack_308._M_allocated_capacity._0_3_ = 0x3030;
          core::ByteData::ByteData((ByteData *)&local_3e8,(string *)local_318);
          core::ByteData::Push(&local_1e8,(ByteData *)&local_3e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._vptr_ConfidentialAssetId !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3e8._vptr_ConfidentialAssetId);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_318 + 0x10)) {
LAB_003c6a56:
            operator_delete(paVar11);
          }
        }
      }
      if (local_278._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_278._vptr_Script);
      }
      puVar2 = local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_408.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1d0);
      core::ByteData::Push(__return_storage_ptr__,&local_298);
      uVar10 = uVar10 + 1;
    } while ((uint32_t)local_280 != uVar10);
  }
  local_318._0_8_ = local_318 + 0x10;
  local_318._8_8_ = (pointer)0x0;
  aStack_308._M_allocated_capacity = aStack_308._M_allocated_capacity & 0xffffffffffffff00;
  local_2f8._M_p = (pointer)&local_2e8;
  local_2f0 = (pointer)0x0;
  local_2e8._M_local_buf[0] = '\0';
  local_2d8._M_p = (pointer)&local_2c8;
  local_2d0 = 0;
  local_2c8._M_local_buf[0] = '\0';
  uVar10 = core::ConfidentialTransaction::GetTxOutCount(&local_320->super_ConfidentialTransaction);
  local_280 = (ulong)uVar10;
  core::ByteData::GetVariableInt((ByteData *)local_1d0,local_280);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1d0);
  if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (uVar10 != 0) {
    uVar14 = 0;
    do {
      core::ConfidentialTransaction::GetTxOut
                ((ConfidentialTxOutReference *)local_1d0,&local_320->super_ConfidentialTransaction,
                 (uint32_t)uVar14);
      pLVar17 = (local_1f0->
                super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar16 = ((long)(local_1f0->
                      super__Vector_base<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar17 >> 5) *
               -0x5555555555555555;
      pLVar17 = pLVar17 + uVar14;
      hex = pLVar17;
      if (uVar16 < uVar14 || uVar16 - uVar14 == 0) {
        hex = (pointer)local_318;
      }
      core::ByteData::ByteData(&local_428);
      if (is_authorization) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&local_278,(ConfidentialValue *)local_158);
        bVar7 = core::ConfidentialValue::HasBlinding((ConfidentialValue *)&local_278);
        local_278._vptr_Script = (_func_int **)&PTR__ConfidentialValue_007357f0;
        if ((uint *)local_278.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_278.script_data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar7) {
          core::ConfidentialAssetId::ConfidentialAssetId
                    (&local_3e8,(ConfidentialAssetId *)(local_1a0 + 0x20));
          core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_348,&local_3e8);
          core::ByteData::ByteData((ByteData *)&local_2b0,(string *)local_348);
          core::ConfidentialValue::ConfidentialValue(&local_3b8,(ConfidentialValue *)local_158);
          core::ConfidentialValue::GetHex_abi_cxx11_(&local_368,&local_3b8);
          std::__cxx11::string::substr((ulong)&local_388,(ulong)&local_368);
          core::ByteData::ByteData(&local_238,&local_388);
          core::Script::Script(&local_278,(Script *)(local_1d0 + 0x18));
          core::Script::GetData(&local_48,&local_278);
          core::ByteData::Serialize(&local_220,&local_48);
          core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                    (&local_408,&local_428,(ByteData *)&local_2b0,&local_238,&local_220);
          puVar2 = local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_408.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_220.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_220.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::Script::~Script(&local_278);
          if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != &local_368.field_2) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          local_3b8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3b8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_);
LAB_003c77f3:
          if (paVar11 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(paVar11);
          }
          _Var15._M_p = (pointer)local_348._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_348 + 0x10)) goto LAB_003c73b1;
          goto LAB_003c73b6;
        }
        pLVar12 = pLVar17;
        if (uVar16 < uVar14 || uVar16 - uVar14 == 0) {
          pLVar12 = (pointer)local_318;
        }
        if ((pLVar12->metadata1)._M_string_length == 0) {
          core::ConfidentialAssetId::ConfidentialAssetId
                    (&local_3e8,(ConfidentialAssetId *)(local_1a0 + 0x20));
          core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_348,&local_3e8);
          core::ByteData::ByteData(&local_408,(string *)local_348);
          core::ConfidentialValue::ConfidentialValue(&local_3b8,(ConfidentialValue *)local_158);
          core::ConfidentialValue::GetHex_abi_cxx11_(&local_388,&local_3b8);
          core::ByteData::ByteData((ByteData *)&local_2b0,&local_388);
          core::Script::Script(&local_278,(Script *)(local_1d0 + 0x18));
          core::Script::GetData(&local_220,&local_278);
          core::ByteData::Serialize(&local_238,&local_220);
          core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                    ((ByteData *)&local_368,&local_428,&local_408,(ByteData *)&local_2b0,&local_238)
          ;
          puVar2 = local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_368._M_dataplus._M_p;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_368._M_string_length;
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_368.field_2._M_allocated_capacity;
          local_368._M_dataplus._M_p = (pointer)0x0;
          local_368._M_string_length = 0;
          local_368.field_2._M_allocated_capacity = 0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_368._M_dataplus._M_p);
          }
          if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_220.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_220.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          core::Script::~Script(&local_278);
          if ((void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_) != (void *)0x0) {
            operator_delete((void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_388._M_dataplus._M_p != &local_388.field_2) {
            operator_delete(local_388._M_dataplus._M_p);
          }
          local_3b8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_3b8.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          goto LAB_003c77f3;
        }
        core::ByteData::ByteData((ByteData *)&local_3b8,&hex->metadata1);
        if (uVar16 < uVar14 || uVar16 - uVar14 == 0) {
          pLVar17 = (pointer)local_318;
        }
        core::ByteData::ByteData((ByteData *)local_348,&pLVar17->metadata2);
        core::Script::Script(&local_278,(Script *)(local_1d0 + 0x18));
        core::Script::GetData((ByteData *)&local_368,&local_278);
        core::ByteData::Serialize((ByteData *)&local_388,(ByteData *)&local_368);
        core::ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_3e8,&local_428,(ByteData *)&local_3b8,(ByteData *)local_348,
                   (ByteData *)&local_388);
        puVar2 = local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_3e8._vptr_ConfidentialAssetId;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_3e8._vptr_ConfidentialAssetId = (_func_int **)0x0;
        local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._vptr_ConfidentialAssetId !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3e8._vptr_ConfidentialAssetId);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_388._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_368._M_dataplus._M_p);
        }
        core::Script::~Script(&local_278);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._vptr_ConfidentialValue;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_348._0_8_);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._vptr_ConfidentialValue;
        }
      }
      else {
        core::ConfidentialAssetId::ConfidentialAssetId
                  (&local_3e8,(ConfidentialAssetId *)(local_1a0 + 0x20));
        core::ConfidentialAssetId::GetData((ByteData *)&local_368,&local_3e8);
        core::ConfidentialValue::ConfidentialValue(&local_3b8,(ConfidentialValue *)local_158);
        core::ConfidentialValue::GetData(&local_408,&local_3b8);
        core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)local_348,(ConfidentialNonce *)local_130);
        core::ConfidentialNonce::GetData((ByteData *)&local_2b0,(ConfidentialNonce *)local_348);
        core::Script::Script(&local_278,(Script *)(local_1d0 + 0x18));
        core::Script::GetData(&local_220,&local_278);
        core::ByteData::Serialize(&local_238,&local_220);
        core::ByteData::
        Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
                  ((ByteData *)&local_388,&local_428,(ByteData *)&local_368,&local_408,
                   (ByteData *)&local_2b0,&local_238);
        puVar2 = local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_388._M_dataplus._M_p;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_388._M_string_length;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_388.field_2._M_allocated_capacity
        ;
        local_388._M_dataplus._M_p = (pointer)0x0;
        local_388._M_string_length = 0;
        local_388.field_2._M_allocated_capacity = 0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_388._M_dataplus._M_p);
        }
        if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_238.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_220.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_220.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        core::Script::~Script(&local_278);
        if ((void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_2b0._4_4_,local_2b0._0_4_));
        }
        local_348._0_8_ = &PTR__ConfidentialNonce_007356c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_348._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_408.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_3b8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_3b8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        _Var15._M_p = local_368._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_003c73b1:
          operator_delete(_Var15._M_p);
        }
LAB_003c73b6:
        local_3e8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      }
      if (paVar11 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(paVar11);
      }
      puVar2 = local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(puVar2);
      }
      if (local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_428.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::ByteData::Push(__return_storage_ptr__,&local_298);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_1d0);
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_280);
  }
  if (bVar1 == 0) {
    if (is_authorization) {
      core::HashUtil::Sha256((ByteData256 *)local_1d0,__return_storage_ptr__);
      core::HashUtil::Sha256((ByteData256 *)&local_278,&local_1e8);
      core::ByteData256::Concat<cfd::core::ByteData256>
                ((ByteData *)&local_3e8,(ByteData256 *)local_1d0,(ByteData256 *)&local_278);
      puVar2 = (__return_storage_ptr__->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      (__return_storage_ptr__->data_).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_3e8._vptr_ConfidentialAssetId;
      (__return_storage_ptr__->data_).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->data_).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_3e8._vptr_ConfidentialAssetId = (_func_int **)0x0;
      local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._vptr_ConfidentialAssetId !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_3e8._vptr_ConfidentialAssetId);
      }
      if (local_278._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_278._vptr_Script);
      }
      if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1d0._0_8_);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p);
    }
    if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
      operator_delete((void *)local_318._0_8_);
    }
    if ((int32_t *)
        local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (int32_t *)0x0) {
      operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_298.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  uVar10 = core::AbstractTransaction::GetLockTime((AbstractTransaction *)local_320);
  local_278._vptr_Script = (_func_int **)CONCAT44(local_278._vptr_Script._4_4_,uVar10);
  memcpy(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,&local_278,
         (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  core::ByteData::ByteData((ByteData *)local_1d0,&local_208);
  core::ByteData::Push(__return_storage_ptr__,(ByteData *)local_1d0);
  if ((pointer)local_1d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"Witness serialization is not implemented.","");
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_1d0);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ByteData LedgerApi::Serialize(
    const ConfidentialTransactionContext& tx,
    const std::vector<LedgerMetaDataStackItem>& metadata_stack,
    bool skip_witness, bool is_authorization) const {
  static auto serialize_input_function =
      [](const ConfidentialTxInReference& txin, bool is_authorization,
         ByteData* issuance) -> ByteData {
    ByteData txin_bytes;
    uint32_t vout = txin.GetVout();
    if (is_authorization) {
      vout &= 0x3fffffff;  // ignore flag
    }
    std::vector<uint8_t> byte_data(sizeof(vout));
    memcpy(byte_data.data(), &vout, byte_data.size());
    txin_bytes = txin.GetTxid().GetData();
    txin_bytes.Push(ByteData(byte_data));
    if (!is_authorization) {
      txin_bytes.Push(txin.GetUnlockingScript().GetData().Serialize());
    }
    uint32_t sequence = txin.GetSequence();
    memcpy(byte_data.data(), &sequence, byte_data.size());
    txin_bytes.Push(ByteData(byte_data));

    if (!issuance || !is_authorization) {
      // do nothing
    } else if (
        txin.GetIssuanceAmount().IsEmpty() &&
        txin.GetInflationKeys().IsEmpty()) {
      issuance->Push(ByteData("00"));
    } else {
      ByteData asset = txin.GetIssuanceAmount().GetData();
      if (asset.IsEmpty()) asset = ByteData("00");
      ByteData token = txin.GetInflationKeys().GetData();
      if (token.IsEmpty()) token = ByteData("00");
      ByteData issuance_bytes;
      issuance_bytes = issuance_bytes.Concat(
          txin.GetBlindingNonce(), txin.GetAssetEntropy(), asset, token);
      issuance->Push(issuance_bytes);
    }
    return txin_bytes;
  };

  static auto serialize_output_function =
      [](const ConfidentialTxOutReference& txout, bool is_authorization,
         const LedgerMetaDataStackItem& metadata) -> ByteData {
    ByteData txout_bytes;
    if (!is_authorization) {
      txout_bytes = txout_bytes.Concat(
          txout.GetAsset().GetData(), txout.GetConfidentialValue().GetData(),
          txout.GetNonce().GetData(),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!txout.GetConfidentialValue().HasBlinding()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex().substr(2)),
          txout.GetLockingScript().GetData().Serialize());
    } else if (!metadata.metadata1.empty()) {
      txout_bytes = txout_bytes.Concat(
          ByteData(metadata.metadata1), ByteData(metadata.metadata2),
          txout.GetLockingScript().GetData().Serialize());
    } else {
      txout_bytes = txout_bytes.Concat(
          ByteData(txout.GetAsset().GetHex()),
          ByteData(txout.GetConfidentialValue().GetHex()),
          txout.GetLockingScript().GetData().Serialize());
    }
    return txout_bytes;
  };

  bool has_witness = (tx.HasWitness() && !skip_witness && !is_authorization);
  ByteData data;
  ByteData temp_data;
  ByteData issuance;

  // version
  int32_t version = tx.GetVersion();
  std::vector<uint8_t> byte_data(sizeof(version));
  memcpy(byte_data.data(), &version, byte_data.size());
  data.Push(ByteData(byte_data));

  // marker & flag (equivalent to bitcoin format)
  if (has_witness) {
    data.Push(ByteData("0001"));
  }

  uint32_t txin_count = tx.GetTxInCount();
  data.Push(ByteData::GetVariableInt(txin_count));
  for (uint32_t index = 0; index < txin_count; ++index) {
    temp_data = serialize_input_function(
        tx.GetTxIn(index), is_authorization, &issuance);
    data.Push(temp_data);
  }

  LedgerMetaDataStackItem empty_item;
  uint32_t txout_count = tx.GetTxOutCount();
  data.Push(ByteData::GetVariableInt(txout_count));
  for (uint32_t index = 0; index < txout_count; ++index) {
    auto txout = tx.GetTxOut(index);
    temp_data = serialize_output_function(
        txout, is_authorization,
        (metadata_stack.size() > index) ? metadata_stack.at(index)
                                        : empty_item);
    data.Push(temp_data);
  }

  if (has_witness) {
    // locktime
    uint32_t locktime = tx.GetLockTime();
    memcpy(byte_data.data(), &locktime, byte_data.size());
    data.Push(ByteData(byte_data));

    // issue rangeproof, token rangeproof, witness, pegin witness
    // surjectionproof, rangeproof
    // FIXME(k-matsuzawa): not implement
    throw CfdException(
        CfdError::kCfdIllegalStateError,
        "Witness serialization is not implemented.");
  }

  if (is_authorization) {
    ByteData256 tx_hash = HashUtil::Sha256(data);
    ByteData256 issuance_hash = HashUtil::Sha256(issuance);
    data = tx_hash.Concat(issuance_hash);
  }

  return data;
}